

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_ncons.cc
# Opt level: O0

int do_i2r_name_constraints
              (X509V3_EXT_METHOD *method,stack_st_GENERAL_SUBTREE *trees,BIO *bp,int ind,char *name)

{
  size_t sVar1;
  GENERAL_SUBTREE *pGVar2;
  ulong local_40;
  size_t i;
  GENERAL_SUBTREE *tree;
  char *name_local;
  int ind_local;
  BIO *bp_local;
  stack_st_GENERAL_SUBTREE *trees_local;
  X509V3_EXT_METHOD *method_local;
  
  sVar1 = sk_GENERAL_SUBTREE_num(trees);
  if (sVar1 != 0) {
    BIO_printf((BIO *)bp,"%*s%s:\n",(ulong)(uint)ind,"",name);
  }
  local_40 = 0;
  while( true ) {
    sVar1 = sk_GENERAL_SUBTREE_num(trees);
    if (sVar1 <= local_40) break;
    pGVar2 = sk_GENERAL_SUBTREE_value(trees,local_40);
    BIO_printf((BIO *)bp,"%*s",(ulong)(ind + 2),"");
    if (pGVar2->base->type == 7) {
      print_nc_ipadd(bp,(pGVar2->base->d).iPAddress);
    }
    else {
      GENERAL_NAME_print((BIO *)bp,(GENERAL_NAME *)pGVar2->base);
    }
    BIO_puts((BIO *)bp,"\n");
    local_40 = local_40 + 1;
  }
  return 1;
}

Assistant:

static int do_i2r_name_constraints(const X509V3_EXT_METHOD *method,
                                   STACK_OF(GENERAL_SUBTREE) *trees, BIO *bp,
                                   int ind, const char *name) {
  GENERAL_SUBTREE *tree;
  size_t i;
  if (sk_GENERAL_SUBTREE_num(trees) > 0) {
    BIO_printf(bp, "%*s%s:\n", ind, "", name);
  }
  for (i = 0; i < sk_GENERAL_SUBTREE_num(trees); i++) {
    tree = sk_GENERAL_SUBTREE_value(trees, i);
    BIO_printf(bp, "%*s", ind + 2, "");
    if (tree->base->type == GEN_IPADD) {
      print_nc_ipadd(bp, tree->base->d.ip);
    } else {
      GENERAL_NAME_print(bp, tree->base);
    }
    BIO_puts(bp, "\n");
  }
  return 1;
}